

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesManager.cxx
# Opt level: O1

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariablesManager::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariablesManager *this,
          VariablesRequest *request)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  p_Var3 = (_Hash_node_base *)(request->variablesReference).val;
  uVar1 = (this->VariablesHandlers)._M_h._M_bucket_count;
  uVar4 = (ulong)p_Var3 % uVar1;
  p_Var5 = (this->VariablesHandlers)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var3 != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var3 == p_Var2[1]._M_nxt)) goto LAB_0044e78f;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0044e78f:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (p_Var3[4]._M_nxt == (_Hash_node_base *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)p_Var3[5]._M_nxt)(__return_storage_ptr__,p_Var3 + 2,request);
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariablesManager::HandleVariablesRequest(
  dap::VariablesRequest const& request)
{
  auto it = VariablesHandlers.find(request.variablesReference);

  if (it != VariablesHandlers.end()) {
    return it->second(request);
  }

  return dap::array<dap::Variable>();
}